

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  long lVar1;
  uint64_t uVar2;
  long in_RDI;
  long in_FS_OFFSET;
  MutexLock lock;
  MutexLock *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock(in_stack_ffffffffffffffc8,(Mutex *)0xd5d594);
  uVar2 = *(uint64_t *)(in_RDI + 0x70);
  MutexLock::~MutexLock(in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }